

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O1

cbtTriangleIndexVertexArray * __thiscall
cbtCollisionWorldImporter::createMeshInterface
          (cbtCollisionWorldImporter *this,cbtStridingMeshInterfaceData *meshData)

{
  int iVar1;
  cbtMeshPartData *pcVar2;
  int **ptr;
  cbtIntIndexData *pcVar3;
  short **ppsVar4;
  cbtShortIntIndexTripletData *pcVar5;
  cbtShortIntIndexData *pcVar6;
  uchar **ptr_00;
  cbtVector3FloatData **ptr_01;
  cbtVector3FloatData *pcVar7;
  cbtVector3DoubleData **ptr_02;
  cbtVector3DoubleData *pcVar8;
  int iVar9;
  undefined4 extraout_var;
  int *piVar10;
  int **ppiVar11;
  short **ppsVar12;
  long lVar13;
  ulong uVar14;
  uchar **ppuVar15;
  uchar *puVar16;
  cbtVector3DoubleData *pcVar17;
  cbtVector3FloatData **ppcVar18;
  cbtVector3DoubleData **ppcVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  cbtIndexedMesh meshPart;
  cbtIndexedMesh local_68;
  cbtTriangleIndexVertexArray *local_38;
  
  iVar9 = (*this->_vptr_cbtCollisionWorldImporter[0x11])();
  local_38 = (cbtTriangleIndexVertexArray *)CONCAT44(extraout_var,iVar9);
  if (0 < meshData->m_numMeshParts) {
    lVar22 = 0;
    do {
      local_68.m_indexType = PHY_INTEGER;
      local_68.m_vertexType = PHY_FLOAT;
      pcVar2 = meshData->m_meshPartsPtr;
      local_68.m_numTriangles = pcVar2[lVar22].m_numTriangles;
      local_68.m_numVertices = pcVar2[lVar22].m_numVertices;
      if (pcVar2[lVar22].m_indices32 == (cbtIntIndexData *)0x0) {
        if (pcVar2[lVar22].m_3indices16 != (cbtShortIntIndexTripletData *)0x0) {
          local_68.m_indexType = PHY_SHORT;
          local_68.m_vertexType = PHY_FLOAT;
          local_68.m_triangleIndexStride = 6;
          piVar10 = (int *)cbtAlignedAllocInternal((long)local_68.m_numTriangles * 6,0x10);
          iVar9 = (this->m_shortIndexArrays).m_size;
          iVar1 = (this->m_shortIndexArrays).m_capacity;
          if (iVar9 == iVar1) {
            iVar23 = iVar9 * 2;
            if (iVar9 == 0) {
              iVar23 = 1;
            }
            if (iVar1 < iVar23) {
              if (iVar23 == 0) {
                ppsVar12 = (short **)0x0;
              }
              else {
                ppsVar12 = (short **)cbtAlignedAllocInternal((long)iVar23 << 3,0x10);
              }
              lVar13 = (long)(this->m_shortIndexArrays).m_size;
              if (0 < lVar13) {
                lVar20 = 0;
                do {
                  ppsVar12[lVar20] = (this->m_shortIndexArrays).m_data[lVar20];
                  lVar20 = lVar20 + 1;
                } while (lVar13 != lVar20);
              }
              ppsVar4 = (this->m_shortIndexArrays).m_data;
              if (ppsVar4 != (short **)0x0) {
                if ((this->m_shortIndexArrays).m_ownsMemory == true) {
                  cbtAlignedFreeInternal(ppsVar4);
                }
                (this->m_shortIndexArrays).m_data = (short **)0x0;
              }
              (this->m_shortIndexArrays).m_ownsMemory = true;
              (this->m_shortIndexArrays).m_data = ppsVar12;
              (this->m_shortIndexArrays).m_capacity = iVar23;
            }
          }
          iVar9 = (this->m_shortIndexArrays).m_size;
          (this->m_shortIndexArrays).m_data[iVar9] = (short *)piVar10;
          (this->m_shortIndexArrays).m_size = iVar9 + 1;
          local_68.m_triangleIndexBase = (uchar *)piVar10;
          if (0 < (long)local_68.m_numTriangles) {
            pcVar5 = meshData->m_meshPartsPtr[lVar22].m_3indices16;
            piVar10 = piVar10 + 1;
            lVar13 = 0;
            do {
              *(short *)(piVar10 + -1) = pcVar5[lVar13].m_values[0];
              *(short *)((long)piVar10 + -2) = pcVar5[lVar13].m_values[1];
              *(short *)piVar10 = pcVar5[lVar13].m_values[2];
              lVar13 = lVar13 + 1;
              piVar10 = (int *)((long)piVar10 + 6);
            } while (local_68.m_numTriangles != lVar13);
          }
        }
        if (meshData->m_meshPartsPtr[lVar22].m_indices16 != (cbtShortIntIndexData *)0x0) {
          local_68.m_indexType = 3;
          local_68.m_triangleIndexStride = 6;
          piVar10 = (int *)cbtAlignedAllocInternal((long)local_68.m_numTriangles * 6,0x10);
          iVar9 = (this->m_shortIndexArrays).m_size;
          iVar1 = (this->m_shortIndexArrays).m_capacity;
          if (iVar9 == iVar1) {
            iVar23 = iVar9 * 2;
            if (iVar9 == 0) {
              iVar23 = 1;
            }
            if (iVar1 < iVar23) {
              if (iVar23 == 0) {
                ppsVar12 = (short **)0x0;
              }
              else {
                ppsVar12 = (short **)cbtAlignedAllocInternal((long)iVar23 << 3,0x10);
              }
              lVar13 = (long)(this->m_shortIndexArrays).m_size;
              if (0 < lVar13) {
                lVar20 = 0;
                do {
                  ppsVar12[lVar20] = (this->m_shortIndexArrays).m_data[lVar20];
                  lVar20 = lVar20 + 1;
                } while (lVar13 != lVar20);
              }
              ppsVar4 = (this->m_shortIndexArrays).m_data;
              if (ppsVar4 != (short **)0x0) {
                if ((this->m_shortIndexArrays).m_ownsMemory == true) {
                  cbtAlignedFreeInternal(ppsVar4);
                }
                (this->m_shortIndexArrays).m_data = (short **)0x0;
              }
              (this->m_shortIndexArrays).m_ownsMemory = true;
              (this->m_shortIndexArrays).m_data = ppsVar12;
              (this->m_shortIndexArrays).m_capacity = iVar23;
            }
          }
          iVar9 = (this->m_shortIndexArrays).m_size;
          (this->m_shortIndexArrays).m_data[iVar9] = (short *)piVar10;
          (this->m_shortIndexArrays).m_size = iVar9 + 1;
          local_68.m_triangleIndexBase = (uchar *)piVar10;
          if (0 < local_68.m_numTriangles) {
            pcVar6 = meshData->m_meshPartsPtr[lVar22].m_indices16;
            uVar14 = (ulong)(uint)(local_68.m_numTriangles * 3);
            if (local_68.m_numTriangles * 3 < 2) {
              uVar14 = 1;
            }
            uVar21 = 0;
            do {
              *(short *)((long)piVar10 + uVar21 * 2) = pcVar6[uVar21].m_value;
              uVar21 = uVar21 + 1;
            } while (uVar14 != uVar21);
          }
        }
        if (meshData->m_meshPartsPtr[lVar22].m_3indices8 != (cbtCharIndexTripletData *)0x0) {
          local_68.m_indexType = 5;
          local_68.m_triangleIndexStride = 3;
          piVar10 = (int *)cbtAlignedAllocInternal((long)local_68.m_numTriangles * 3,0x10);
          iVar9 = (this->m_charIndexArrays).m_size;
          iVar1 = (this->m_charIndexArrays).m_capacity;
          if (iVar9 == iVar1) {
            iVar23 = iVar9 * 2;
            if (iVar9 == 0) {
              iVar23 = 1;
            }
            if (iVar1 < iVar23) {
              if (iVar23 == 0) {
                ppuVar15 = (uchar **)0x0;
              }
              else {
                ppuVar15 = (uchar **)cbtAlignedAllocInternal((long)iVar23 << 3,0x10);
              }
              lVar13 = (long)(this->m_charIndexArrays).m_size;
              if (0 < lVar13) {
                lVar20 = 0;
                do {
                  ppuVar15[lVar20] = (this->m_charIndexArrays).m_data[lVar20];
                  lVar20 = lVar20 + 1;
                } while (lVar13 != lVar20);
              }
              ptr_00 = (this->m_charIndexArrays).m_data;
              if (ptr_00 != (uchar **)0x0) {
                if ((this->m_charIndexArrays).m_ownsMemory == true) {
                  cbtAlignedFreeInternal(ptr_00);
                }
                (this->m_charIndexArrays).m_data = (uchar **)0x0;
              }
              (this->m_charIndexArrays).m_ownsMemory = true;
              (this->m_charIndexArrays).m_data = ppuVar15;
              (this->m_charIndexArrays).m_capacity = iVar23;
            }
          }
          iVar9 = (this->m_charIndexArrays).m_size;
          (this->m_charIndexArrays).m_data[iVar9] = (uchar *)piVar10;
          (this->m_charIndexArrays).m_size = iVar9 + 1;
          local_68.m_triangleIndexBase = (uchar *)piVar10;
          if (0 < local_68.m_numTriangles) {
            puVar16 = (uchar *)((long)piVar10 + 2);
            lVar13 = 0;
            do {
              puVar16[-2] = meshData->m_meshPartsPtr[lVar22].m_3indices8[lVar13].m_values[0];
              puVar16[-1] = meshData->m_meshPartsPtr[lVar22].m_3indices8[lVar13].m_values[1];
              *puVar16 = meshData->m_meshPartsPtr[lVar22].m_3indices8[lVar13].m_values[2];
              lVar13 = lVar13 + 1;
              puVar16 = puVar16 + 3;
            } while (lVar13 < local_68.m_numTriangles);
          }
        }
      }
      else {
        local_68.m_indexType = PHY_INTEGER;
        local_68.m_vertexType = PHY_FLOAT;
        local_68.m_triangleIndexStride = 0xc;
        piVar10 = (int *)cbtAlignedAllocInternal((long)local_68.m_numTriangles * 0xc,0x10);
        iVar9 = (this->m_indexArrays).m_size;
        iVar1 = (this->m_indexArrays).m_capacity;
        if (iVar9 == iVar1) {
          iVar23 = iVar9 * 2;
          if (iVar9 == 0) {
            iVar23 = 1;
          }
          if (iVar1 < iVar23) {
            if (iVar23 == 0) {
              ppiVar11 = (int **)0x0;
            }
            else {
              ppiVar11 = (int **)cbtAlignedAllocInternal((long)iVar23 << 3,0x10);
            }
            lVar13 = (long)(this->m_indexArrays).m_size;
            if (0 < lVar13) {
              lVar20 = 0;
              do {
                ppiVar11[lVar20] = (this->m_indexArrays).m_data[lVar20];
                lVar20 = lVar20 + 1;
              } while (lVar13 != lVar20);
            }
            ptr = (this->m_indexArrays).m_data;
            if (ptr != (int **)0x0) {
              if ((this->m_indexArrays).m_ownsMemory == true) {
                cbtAlignedFreeInternal(ptr);
              }
              (this->m_indexArrays).m_data = (int **)0x0;
            }
            (this->m_indexArrays).m_ownsMemory = true;
            (this->m_indexArrays).m_data = ppiVar11;
            (this->m_indexArrays).m_capacity = iVar23;
          }
        }
        iVar9 = (this->m_indexArrays).m_size;
        (this->m_indexArrays).m_data[iVar9] = piVar10;
        (this->m_indexArrays).m_size = iVar9 + 1;
        local_68.m_triangleIndexBase = (uchar *)piVar10;
        if (0 < local_68.m_numTriangles) {
          pcVar3 = meshData->m_meshPartsPtr[lVar22].m_indices32;
          lVar13 = 0;
          do {
            piVar10[lVar13] = pcVar3[lVar13].m_value;
            lVar13 = lVar13 + 1;
          } while (lVar13 < (long)local_68.m_numTriangles * 3);
        }
      }
      if (meshData->m_meshPartsPtr[lVar22].m_vertices3f == (cbtVector3FloatData *)0x0) {
        local_68.m_vertexType = 1;
        local_68.m_vertexStride = 0x20;
        pcVar17 = (cbtVector3DoubleData *)
                  cbtAlignedAllocInternal((long)local_68.m_numVertices << 5,0x10);
        iVar9 = (this->m_doubleVertexArrays).m_size;
        iVar1 = (this->m_doubleVertexArrays).m_capacity;
        if (iVar9 == iVar1) {
          iVar23 = iVar9 * 2;
          if (iVar9 == 0) {
            iVar23 = 1;
          }
          if (iVar1 < iVar23) {
            if (iVar23 == 0) {
              ppcVar19 = (cbtVector3DoubleData **)0x0;
            }
            else {
              ppcVar19 = (cbtVector3DoubleData **)cbtAlignedAllocInternal((long)iVar23 << 3,0x10);
            }
            lVar13 = (long)(this->m_doubleVertexArrays).m_size;
            if (0 < lVar13) {
              lVar20 = 0;
              do {
                ppcVar19[lVar20] = (this->m_doubleVertexArrays).m_data[lVar20];
                lVar20 = lVar20 + 1;
              } while (lVar13 != lVar20);
            }
            ptr_02 = (this->m_doubleVertexArrays).m_data;
            if (ptr_02 != (cbtVector3DoubleData **)0x0) {
              if ((this->m_doubleVertexArrays).m_ownsMemory == true) {
                cbtAlignedFreeInternal(ptr_02);
              }
              (this->m_doubleVertexArrays).m_data = (cbtVector3DoubleData **)0x0;
            }
            (this->m_doubleVertexArrays).m_ownsMemory = true;
            (this->m_doubleVertexArrays).m_data = ppcVar19;
            (this->m_doubleVertexArrays).m_capacity = iVar23;
          }
        }
        iVar9 = (this->m_doubleVertexArrays).m_size;
        (this->m_doubleVertexArrays).m_data[iVar9] = pcVar17;
        (this->m_doubleVertexArrays).m_size = iVar9 + 1;
        if (0 < (long)local_68.m_numVertices) {
          pcVar8 = meshData->m_meshPartsPtr[lVar22].m_vertices3d;
          lVar13 = 0;
          do {
            *(undefined8 *)((long)pcVar17->m_floats + lVar13) =
                 *(undefined8 *)((long)pcVar8->m_floats + lVar13);
            *(undefined8 *)((long)pcVar17->m_floats + lVar13 + 8) =
                 *(undefined8 *)((long)pcVar8->m_floats + lVar13 + 8);
            *(undefined8 *)((long)pcVar17->m_floats + lVar13 + 0x10) =
                 *(undefined8 *)((long)pcVar8->m_floats + lVar13 + 0x10);
            *(undefined8 *)((long)pcVar17->m_floats + lVar13 + 0x18) =
                 *(undefined8 *)((long)pcVar8->m_floats + lVar13 + 0x18);
            lVar13 = lVar13 + 0x20;
          } while ((long)local_68.m_numVertices * 0x20 != lVar13);
        }
      }
      else {
        local_68._36_8_ = local_68._36_8_ & 0xffffffff;
        local_68.m_vertexStride = 0x10;
        pcVar17 = (cbtVector3DoubleData *)
                  cbtAlignedAllocInternal((long)local_68.m_numVertices << 4,0x10);
        iVar9 = (this->m_floatVertexArrays).m_size;
        iVar1 = (this->m_floatVertexArrays).m_capacity;
        if (iVar9 == iVar1) {
          iVar23 = iVar9 * 2;
          if (iVar9 == 0) {
            iVar23 = 1;
          }
          if (iVar1 < iVar23) {
            if (iVar23 == 0) {
              ppcVar18 = (cbtVector3FloatData **)0x0;
            }
            else {
              ppcVar18 = (cbtVector3FloatData **)cbtAlignedAllocInternal((long)iVar23 << 3,0x10);
            }
            lVar13 = (long)(this->m_floatVertexArrays).m_size;
            if (0 < lVar13) {
              lVar20 = 0;
              do {
                ppcVar18[lVar20] = (this->m_floatVertexArrays).m_data[lVar20];
                lVar20 = lVar20 + 1;
              } while (lVar13 != lVar20);
            }
            ptr_01 = (this->m_floatVertexArrays).m_data;
            if (ptr_01 != (cbtVector3FloatData **)0x0) {
              if ((this->m_floatVertexArrays).m_ownsMemory == true) {
                cbtAlignedFreeInternal(ptr_01);
              }
              (this->m_floatVertexArrays).m_data = (cbtVector3FloatData **)0x0;
            }
            (this->m_floatVertexArrays).m_ownsMemory = true;
            (this->m_floatVertexArrays).m_data = ppcVar18;
            (this->m_floatVertexArrays).m_capacity = iVar23;
          }
        }
        iVar9 = (this->m_floatVertexArrays).m_size;
        (this->m_floatVertexArrays).m_data[iVar9] = (cbtVector3FloatData *)pcVar17;
        (this->m_floatVertexArrays).m_size = iVar9 + 1;
        if (0 < (long)local_68.m_numVertices) {
          pcVar7 = meshData->m_meshPartsPtr[lVar22].m_vertices3f;
          lVar13 = 0;
          do {
            *(undefined4 *)((long)pcVar17->m_floats + lVar13) =
                 *(undefined4 *)((long)pcVar7->m_floats + lVar13);
            *(undefined4 *)((long)pcVar17->m_floats + lVar13 + 4) =
                 *(undefined4 *)((long)pcVar7->m_floats + lVar13 + 4);
            *(undefined4 *)((long)pcVar17->m_floats + lVar13 + 8) =
                 *(undefined4 *)((long)pcVar7->m_floats + lVar13 + 8);
            *(undefined4 *)((long)pcVar17->m_floats + lVar13 + 0xc) =
                 *(undefined4 *)((long)pcVar7->m_floats + lVar13 + 0xc);
            lVar13 = lVar13 + 0x10;
          } while ((long)local_68.m_numVertices * 0x10 != lVar13);
        }
      }
      local_68.m_vertexBase = (uchar *)pcVar17;
      if (((int *)local_68.m_triangleIndexBase != (int *)0x0) &&
         (pcVar17 != (cbtVector3DoubleData *)0x0)) {
        cbtTriangleIndexVertexArray::addIndexedMesh(local_38,&local_68,local_68.m_indexType);
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 < meshData->m_numMeshParts);
  }
  return local_38;
}

Assistant:

cbtTriangleIndexVertexArray* cbtCollisionWorldImporter::createMeshInterface(cbtStridingMeshInterfaceData& meshData)
{
	cbtTriangleIndexVertexArray* meshInterface = createTriangleMeshContainer();

	for (int i = 0; i < meshData.m_numMeshParts; i++)
	{
		cbtIndexedMesh meshPart;
		meshPart.m_numTriangles = meshData.m_meshPartsPtr[i].m_numTriangles;
		meshPart.m_numVertices = meshData.m_meshPartsPtr[i].m_numVertices;

		if (meshData.m_meshPartsPtr[i].m_indices32)
		{
			meshPart.m_indexType = PHY_INTEGER;
			meshPart.m_triangleIndexStride = 3 * sizeof(int);
			int* indexArray = (int*)cbtAlignedAlloc(sizeof(int) * 3 * meshPart.m_numTriangles, 16);
			m_indexArrays.push_back(indexArray);
			for (int j = 0; j < 3 * meshPart.m_numTriangles; j++)
			{
				indexArray[j] = meshData.m_meshPartsPtr[i].m_indices32[j].m_value;
			}
			meshPart.m_triangleIndexBase = (const unsigned char*)indexArray;
		}
		else
		{
			if (meshData.m_meshPartsPtr[i].m_3indices16)
			{
				meshPart.m_indexType = PHY_SHORT;
				meshPart.m_triangleIndexStride = sizeof(short int) * 3;  //sizeof(cbtShortIntIndexTripletData);

				short int* indexArray = (short int*)cbtAlignedAlloc(sizeof(short int) * 3 * meshPart.m_numTriangles, 16);
				m_shortIndexArrays.push_back(indexArray);

				for (int j = 0; j < meshPart.m_numTriangles; j++)
				{
					indexArray[3 * j] = meshData.m_meshPartsPtr[i].m_3indices16[j].m_values[0];
					indexArray[3 * j + 1] = meshData.m_meshPartsPtr[i].m_3indices16[j].m_values[1];
					indexArray[3 * j + 2] = meshData.m_meshPartsPtr[i].m_3indices16[j].m_values[2];
				}

				meshPart.m_triangleIndexBase = (const unsigned char*)indexArray;
			}
			if (meshData.m_meshPartsPtr[i].m_indices16)
			{
				meshPart.m_indexType = PHY_SHORT;
				meshPart.m_triangleIndexStride = 3 * sizeof(short int);
				short int* indexArray = (short int*)cbtAlignedAlloc(sizeof(short int) * 3 * meshPart.m_numTriangles, 16);
				m_shortIndexArrays.push_back(indexArray);
				for (int j = 0; j < 3 * meshPart.m_numTriangles; j++)
				{
					indexArray[j] = meshData.m_meshPartsPtr[i].m_indices16[j].m_value;
				}

				meshPart.m_triangleIndexBase = (const unsigned char*)indexArray;
			}

			if (meshData.m_meshPartsPtr[i].m_3indices8)
			{
				meshPart.m_indexType = PHY_UCHAR;
				meshPart.m_triangleIndexStride = sizeof(unsigned char) * 3;

				unsigned char* indexArray = (unsigned char*)cbtAlignedAlloc(sizeof(unsigned char) * 3 * meshPart.m_numTriangles, 16);
				m_charIndexArrays.push_back(indexArray);

				for (int j = 0; j < meshPart.m_numTriangles; j++)
				{
					indexArray[3 * j] = meshData.m_meshPartsPtr[i].m_3indices8[j].m_values[0];
					indexArray[3 * j + 1] = meshData.m_meshPartsPtr[i].m_3indices8[j].m_values[1];
					indexArray[3 * j + 2] = meshData.m_meshPartsPtr[i].m_3indices8[j].m_values[2];
				}

				meshPart.m_triangleIndexBase = (const unsigned char*)indexArray;
			}
		}

		if (meshData.m_meshPartsPtr[i].m_vertices3f)
		{
			meshPart.m_vertexType = PHY_FLOAT;
			meshPart.m_vertexStride = sizeof(cbtVector3FloatData);
			cbtVector3FloatData* vertices = (cbtVector3FloatData*)cbtAlignedAlloc(sizeof(cbtVector3FloatData) * meshPart.m_numVertices, 16);
			m_floatVertexArrays.push_back(vertices);

			for (int j = 0; j < meshPart.m_numVertices; j++)
			{
				vertices[j].m_floats[0] = meshData.m_meshPartsPtr[i].m_vertices3f[j].m_floats[0];
				vertices[j].m_floats[1] = meshData.m_meshPartsPtr[i].m_vertices3f[j].m_floats[1];
				vertices[j].m_floats[2] = meshData.m_meshPartsPtr[i].m_vertices3f[j].m_floats[2];
				vertices[j].m_floats[3] = meshData.m_meshPartsPtr[i].m_vertices3f[j].m_floats[3];
			}
			meshPart.m_vertexBase = (const unsigned char*)vertices;
		}
		else
		{
			meshPart.m_vertexType = PHY_DOUBLE;
			meshPart.m_vertexStride = sizeof(cbtVector3DoubleData);

			cbtVector3DoubleData* vertices = (cbtVector3DoubleData*)cbtAlignedAlloc(sizeof(cbtVector3DoubleData) * meshPart.m_numVertices, 16);
			m_doubleVertexArrays.push_back(vertices);

			for (int j = 0; j < meshPart.m_numVertices; j++)
			{
				vertices[j].m_floats[0] = meshData.m_meshPartsPtr[i].m_vertices3d[j].m_floats[0];
				vertices[j].m_floats[1] = meshData.m_meshPartsPtr[i].m_vertices3d[j].m_floats[1];
				vertices[j].m_floats[2] = meshData.m_meshPartsPtr[i].m_vertices3d[j].m_floats[2];
				vertices[j].m_floats[3] = meshData.m_meshPartsPtr[i].m_vertices3d[j].m_floats[3];
			}
			meshPart.m_vertexBase = (const unsigned char*)vertices;
		}

		if (meshPart.m_triangleIndexBase && meshPart.m_vertexBase)
		{
			meshInterface->addIndexedMesh(meshPart, meshPart.m_indexType);
		}
	}

	return meshInterface;
}